

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendFlags
          (cmLocalUnixMakefileGenerator3 *this,string *flags,string *newFlags)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  string newf;
  string local_48;
  
  bVar2 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if ((bVar2) && (newFlags->_M_string_length != 0)) {
    pcVar1 = (newFlags->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + newFlags->_M_string_length);
    lVar3 = std::__cxx11::string::find((char *)&local_48,0x6b5afa,0);
    if (lVar3 != -1) {
      cmsys::SystemTools::ReplaceString(&local_48,"\\\"","\"");
      cmLocalGenerator::AppendFlags((cmLocalGenerator *)this,flags,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (lVar3 != -1) {
      return;
    }
  }
  cmLocalGenerator::AppendFlags((cmLocalGenerator *)this,flags,newFlags);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendFlags(
  std::string& flags, const std::string& newFlags) const
{
  if (this->IsWatcomWMake() && !newFlags.empty()) {
    std::string newf = newFlags;
    if (newf.find("\\\"") != std::string::npos) {
      cmSystemTools::ReplaceString(newf, "\\\"", "\"");
      this->cmLocalGenerator::AppendFlags(flags, newf);
      return;
    }
  }
  this->cmLocalGenerator::AppendFlags(flags, newFlags);
}